

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fft.hpp
# Opt level: O2

void __thiscall
re::fft::real_fft<float,_4096L,_(re::fft::direction)0>::real_fft
          (real_fft<float,_4096L,_(re::fft::direction)0> *this)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  fft<float,_2048L,_(re::fft::direction)0>::fft(&this->fft_);
  memset(&this->twiddles,0,0x4000);
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 1) {
    fVar2 = (float)(lVar1 + 0x400) * 0.0015339808;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    (this->twiddles)._M_elems[lVar1]._M_value = CONCAT44(fVar2,fVar3);
  }
  return;
}

Assistant:

real_fft() noexcept
    {
        auto const step = (is_inverse(Direction) ? -2 : 2) * pi<real_t> / N;
        for (auto i = 0u; i < std::size(twiddles); ++i) {
            twiddles[i] = std::polar(real_t{1}, (i + N / 4) * step);
        }
    }